

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Low_options>::rec_delete(Simplex_tree<Low_options> *this,Siblings *sib)

{
  Siblings *sib_00;
  pointer ppVar1;
  iterator sh;
  
  ppVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  sh.m_ptr = (pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
              *)ppVar1;
  while (sh.m_ptr !=
         (pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>
          *)(ppVar1 + (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
    sib_00 = ((sh.m_ptr)->second).children_;
    if (sib_00->parent_ == (sh.m_ptr)->first) {
      rec_delete(this,sib_00);
    }
    boost::container::
    vec_iterator<std::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_*,_false>
    ::operator++(&sh);
    ppVar1 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  }
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::~vector_alloc_holder
            ((vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
              *)&sib->members_);
  operator_delete(sib,0x28);
  return;
}

Assistant:

void rec_delete(Siblings * sib) {
    for (auto sh = sib->members().begin(); sh != sib->members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    delete sib;
  }